

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O2

int __thiscall Fl_File_Icon::load_image(Fl_File_Icon *this,char *ifile)

{
  int iVar1;
  char **ppcVar2;
  Fl_File_Icon *pFVar3;
  Fl_Color FVar4;
  uchar uVar5;
  Fl_Color FVar6;
  int iVar7;
  Fl_Color FVar8;
  Fl_Shared_Image *this_00;
  void *__s;
  char *pcVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uchar uVar13;
  int iVar14;
  byte bVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  int iVar20;
  uchar *puVar21;
  ulong uVar22;
  uchar uVar23;
  char **ppcVar24;
  bool bVar25;
  uint local_94;
  char val [16];
  int ncolors;
  ulong local_60;
  int chars_per_color;
  ulong local_50;
  Fl_File_Icon *local_48;
  char **local_40;
  int local_34;
  
  local_48 = this;
  this_00 = Fl_Shared_Image::get(ifile,0,0);
  iVar7 = -1;
  if ((((this_00 != (Fl_Shared_Image *)0x0) &&
       (iVar12 = (this_00->super_Fl_Image).count_, iVar12 != 0)) &&
      (iVar14 = (this_00->super_Fl_Image).w_, iVar14 != 0)) &&
     (iVar20 = (this_00->super_Fl_Image).h_, iVar20 != 0)) {
    if (iVar12 == 1) {
      iVar7 = (this_00->super_Fl_Image).ld_;
      uVar18 = 0;
      if (iVar7 == 0) {
        local_60 = 0;
      }
      else {
        local_60 = (ulong)(iVar7 - iVar14 * (this_00->super_Fl_Image).d_);
      }
      puVar21 = (uchar *)*(this_00->super_Fl_Image).data_;
      while ((int)uVar18 < iVar20) {
        iVar12 = uVar18 * 9000;
        iVar7 = iVar12 + 9000;
        iVar20 = 0;
        local_94 = 0;
        FVar6 = 0xffffffff;
        local_50 = (ulong)uVar18;
        for (iVar14 = 0; pFVar3 = local_48, iVar14 < (this_00->super_Fl_Image).w_;
            iVar14 = iVar14 + 1) {
          iVar1 = (this_00->super_Fl_Image).d_;
          if (iVar1 == 3) {
LAB_00203749:
            uVar13 = *puVar21;
            uVar23 = puVar21[2];
            uVar5 = puVar21[1];
LAB_0020376e:
            FVar8 = fl_rgb_color(uVar13,uVar5,uVar23);
          }
          else if (iVar1 == 2) {
            FVar8 = 0xffffffff;
            if ((char)puVar21[1] < '\0') goto LAB_00203765;
          }
          else {
            if (iVar1 == 1) {
LAB_00203765:
              uVar13 = *puVar21;
              uVar23 = uVar13;
              uVar5 = uVar13;
              goto LAB_0020376e;
            }
            FVar8 = 0xffffffff;
            if ((char)puVar21[3] < '\0') goto LAB_00203749;
          }
          pFVar3 = local_48;
          uVar18 = local_94;
          FVar4 = FVar6;
          if (((FVar8 != FVar6) && (uVar18 = iVar14, FVar4 = FVar8, (int)local_94 < iVar14)) &&
             (FVar6 != 0xffffffff)) {
            add_color(local_48,FVar6);
            add(pFVar3,4);
            add_vertex(pFVar3,(int)(local_94 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar12 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar12 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar7 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar3,(int)(local_94 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar7 / (this_00->super_Fl_Image).h_);
            add(pFVar3,0);
          }
          FVar6 = FVar4;
          local_94 = uVar18;
          puVar21 = puVar21 + (this_00->super_Fl_Image).d_;
          iVar20 = iVar20 + 9000;
        }
        if (((int)local_94 < iVar14) && (FVar6 != 0xffffffff)) {
          add_color(local_48,FVar6);
          add(pFVar3,4);
          add_vertex(pFVar3,(int)(local_94 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - iVar12 / (this_00->super_Fl_Image).h_);
          add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - iVar12 / (this_00->super_Fl_Image).h_);
          add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - iVar7 / (this_00->super_Fl_Image).h_);
          add_vertex(pFVar3,(int)(local_94 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - iVar7 / (this_00->super_Fl_Image).h_);
          add(pFVar3,0);
        }
        puVar21 = puVar21 + local_60;
        iVar20 = (this_00->super_Fl_Image).h_;
        uVar18 = (int)local_50 + 1;
      }
    }
    else {
      ppcVar2 = (this_00->super_Fl_Image).data_;
      __isoc99_sscanf(*ppcVar2,"%*d%*d%d%d",&ncolors,&chars_per_color);
      bVar15 = (char)chars_per_color << 3;
      __s = operator_new__((ulong)(uint)(4 << (bVar15 & 0x1f)));
      memset(__s,0,4L << (bVar15 & 0x3f));
      ppcVar24 = ppcVar2 + 1;
      if (ncolors < 0) {
        ncolors = -ncolors;
        pcVar9 = *ppcVar24;
        for (lVar10 = 0; (int)lVar10 < ncolors; lVar10 = lVar10 + 1) {
          FVar6 = fl_rgb_color(pcVar9[lVar10 * 4 + 1],pcVar9[lVar10 * 4 + 2],pcVar9[lVar10 * 4 + 3])
          ;
          *(Fl_Color *)((long)__s + (ulong)(byte)pcVar9[lVar10 * 4] * 4) = FVar6;
        }
        ppcVar24 = ppcVar2 + 2;
        local_94 = 0x20;
      }
      else {
        local_94 = 0x20;
        iVar7 = ncolors;
        for (iVar12 = 0; iVar12 < iVar7; iVar12 = iVar12 + 1) {
          pcVar9 = *ppcVar24;
          uVar18 = (uint)*pcVar9;
          if (chars_per_color < 2) {
            pcVar19 = pcVar9 + 1;
          }
          else {
            pcVar19 = pcVar9 + 2;
            uVar18 = uVar18 << 8 | (int)pcVar9[1];
          }
          pcVar9 = strstr(pcVar19,"c ");
          lVar10 = (long)(int)uVar18;
          if (pcVar9 == (char *)0x0) {
LAB_002034b7:
            *(undefined4 *)((long)__s + lVar10 * 4) = 0x38;
          }
          else if (pcVar9[2] == '#') {
            local_40 = ppcVar24;
            for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 1) {
              iVar7 = isxdigit((int)pcVar9[lVar17 + 3]);
              if (iVar7 == 0) {
                uVar13 = '\0';
                uVar16 = local_94;
                switch((int)lVar17) {
                case 3:
                  val[0] = pcVar9[3];
                  val[1] = '\0';
                  lVar17 = strtol(val,(char **)0x0,0x10);
                  uVar13 = (char)lVar17 * '\x11';
                  val[0] = pcVar9[4];
                  val[1] = '\0';
                  lVar17 = strtol(val,(char **)0x0,0x10);
                  uVar23 = (char)lVar17 * '\x11';
                  val[0] = pcVar9[5];
                  val[1] = '\0';
                  lVar17 = strtol(val,(char **)0x0,0x10);
                  uVar5 = (char)lVar17 * '\x11';
                  break;
                case 4:
                case 5:
                case 7:
                case 8:
                case 10:
                case 0xb:
                  goto switchD_0020354e_caseD_4;
                case 6:
                case 9:
                case 0xc:
                  goto switchD_0020354e_caseD_6;
                default:
                  uVar23 = '\0';
                  uVar5 = '\0';
                  uVar16 = uVar18;
                  if ((int)lVar17 != 0) break;
switchD_0020354e_caseD_4:
                  local_94 = uVar16;
                  uVar13 = '\0';
                  uVar23 = '\0';
                  uVar5 = '\0';
                }
                goto LAB_002035e0;
              }
            }
            lVar17 = 0xc;
switchD_0020354e_caseD_6:
            val[0] = pcVar9[3];
            val[1] = pcVar9[4];
            val[2] = '\0';
            lVar11 = strtol(val,(char **)0x0,0x10);
            uVar22 = (ulong)(byte)(((ushort)lVar17 & 0xff) / 3);
            val[0] = pcVar9[uVar22 + 3];
            val[1] = pcVar9[uVar22 + 4];
            val[2] = '\0';
            lVar17 = strtol(val,(char **)0x0,0x10);
            uVar23 = (uchar)lVar17;
            val[0] = pcVar9[uVar22 * 2 + 3];
            val[1] = pcVar9[uVar22 * 2 + 4];
            val[2] = '\0';
            lVar17 = strtol(val,(char **)0x0,0x10);
            uVar5 = (uchar)lVar17;
            uVar13 = (uchar)lVar11;
LAB_002035e0:
            FVar6 = fl_rgb_color(uVar13,uVar23,uVar5);
            *(Fl_Color *)((long)__s + lVar10 * 4) = FVar6;
            ppcVar24 = local_40;
            iVar7 = ncolors;
          }
          else {
            pcVar9 = pcVar9 + 2;
            iVar14 = strncasecmp(pcVar9,"white",5);
            if (iVar14 == 0) {
              *(undefined4 *)((long)__s + lVar10 * 4) = 0xff;
            }
            else {
              iVar14 = strncasecmp(pcVar9,"black",5);
              if (iVar14 == 0) goto LAB_002034b7;
              iVar14 = strncasecmp(pcVar9,"none",4);
              if (iVar14 == 0) {
                *(undefined4 *)((long)__s + lVar10 * 4) = 0x38;
                local_94 = uVar18;
              }
              else {
                *(undefined4 *)((long)__s + lVar10 * 4) = 0x31;
              }
            }
          }
          ppcVar24 = ppcVar24 + 1;
        }
      }
      iVar7 = 0;
      while (iVar7 < (this_00->super_Fl_Image).h_) {
        pcVar9 = *ppcVar24;
        local_60 = (ulong)(uint)(iVar7 * 9000);
        local_50 = CONCAT44(local_50._4_4_,iVar7 * 9000 + 9000);
        iVar20 = 0;
        uVar18 = local_94;
        iVar12 = 0;
        local_40 = ppcVar24;
        local_34 = iVar7;
        for (iVar14 = 0; pFVar3 = local_48, lVar10 = (long)(int)uVar18,
            iVar14 < (this_00->super_Fl_Image).w_; iVar14 = iVar14 + 1) {
          uVar16 = (uint)*pcVar9;
          if (chars_per_color < 2) {
            pcVar9 = pcVar9 + 1;
          }
          else {
            pcVar19 = pcVar9 + 1;
            pcVar9 = pcVar9 + 2;
            uVar16 = uVar16 << 8 | (int)*pcVar19;
          }
          iVar7 = iVar12;
          if ((uVar16 != uVar18) &&
             (bVar25 = uVar18 != local_94, uVar18 = uVar16, iVar7 = iVar14, bVar25)) {
            add_color(local_48,*(Fl_Color *)((long)__s + lVar10 * 4));
            add(pFVar3,4);
            uVar22 = local_60;
            uVar16 = (int)local_60 >> 0x1f;
            add_vertex(pFVar3,(iVar12 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (int)((long)((ulong)uVar16 << 0x20 | local_60 & 0xffffffff) /
                                     (long)(this_00->super_Fl_Image).h_));
            add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (int)((long)((ulong)uVar16 << 0x20 | uVar22 & 0xffffffff) /
                                     (long)(this_00->super_Fl_Image).h_));
            iVar1 = (int)local_50;
            add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (int)local_50 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar3,(iVar12 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar1 / (this_00->super_Fl_Image).h_);
            add(pFVar3,0);
          }
          iVar20 = iVar20 + 9000;
          iVar12 = iVar7;
        }
        if (uVar18 != local_94) {
          add_color(local_48,*(Fl_Color *)((long)__s + lVar10 * 4));
          add(pFVar3,4);
          uVar22 = local_60;
          uVar18 = (int)local_60 >> 0x1f;
          add_vertex(pFVar3,(iVar12 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - (int)((long)((ulong)uVar18 << 0x20 | local_60 & 0xffffffff) /
                                   (long)(this_00->super_Fl_Image).h_));
          add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - (int)((long)((ulong)uVar18 << 0x20 | uVar22 & 0xffffffff) /
                                   (long)(this_00->super_Fl_Image).h_));
          iVar7 = (int)local_50;
          add_vertex(pFVar3,iVar20 / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - (int)local_50 / (this_00->super_Fl_Image).h_);
          add_vertex(pFVar3,(iVar12 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                     0x251c - iVar7 / (this_00->super_Fl_Image).h_);
          add(pFVar3,0);
        }
        ppcVar24 = local_40 + 1;
        iVar7 = local_34 + 1;
      }
      operator_delete__(__s);
    }
    Fl_Shared_Image::release(this_00);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int Fl_File_Icon::load_image(const char *ifile)	// I - File to read from
{
  Fl_Shared_Image	*img;		// Image file


  img = Fl_Shared_Image::get(ifile);
  if (!img || !img->count() || !img->w() || !img->h()) return -1;

  if (img->count() == 1) {
    int		x, y;		// X & Y in image
    int		startx;		// Starting X coord
    Fl_Color	c,		// Current color
		temp;		// Temporary color
    const uchar *row;		// Pointer into image

    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;

    // Loop through grayscale or RGB image...
    for (y = 0, row = (const uchar *)(*(img->data())); y < img->h(); y ++, row += extra_data)
    {
      for (x = 0, startx = 0, c = (Fl_Color)-1;
           x < img->w();
	   x ++, row += img->d())
      {
	switch (img->d())
	{
          case 1 :
              temp = fl_rgb_color(row[0], row[0], row[0]);
	      break;
          case 2 :
	      if (row[1] > 127)
        	temp = fl_rgb_color(row[0], row[0], row[0]);
	      else
		temp = (Fl_Color)-1;
	      break;
	  case 3 :
              temp = fl_rgb_color(row[0], row[1], row[2]);
	      break;
	  default :
	      if (row[3] > 127)
        	temp = fl_rgb_color(row[0], row[1], row[2]);
	      else
		temp = (Fl_Color)-1;
	      break;
	}

	if (temp != c)
	{
	  if (x > startx && c != (Fl_Color)-1)
	  {
	    add_color(c);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
	  }

          c      = temp;
	  startx = x;
	}
      }

      if (x > startx && c != (Fl_Color)-1)
      {
	add_color(c);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }
  } else {
    int		i, j;			// Looping vars
    int		ch;			// Current character
    int		newch;			// New character
    int		bg;			// Background color
    char	val[16];		// Color value
    const char	*lineptr,		// Pointer into line
		*const*ptr;		// Pointer into data array
    int		ncolors,		// Number of colors
		chars_per_color;	// Characters per color
    Fl_Color	*colors;		// Colors
    int		red, green, blue;	// Red, green, and blue values
    int		x, y;			// X & Y in image
    int		startx;			// Starting X coord

    // Get the pixmap data...
    ptr = img->data();
    sscanf(*ptr, "%*d%*d%d%d", &ncolors, &chars_per_color);

    colors = new Fl_Color[1 << (chars_per_color * 8)];

    // Read the colormap...
    memset(colors, 0, sizeof(Fl_Color) << (chars_per_color * 8));
    bg = ' ';

    ptr ++;

    if (ncolors < 0) {
      // Read compressed colormap...
      const uchar *cmapptr;

      ncolors = -ncolors;

      for (i = 0, cmapptr = (const uchar *)*ptr; i < ncolors; i ++, cmapptr += 4)
        colors[cmapptr[0]] = fl_rgb_color(cmapptr[1], cmapptr[2], cmapptr[3]);

      ptr ++;
    } else {
      for (i = 0; i < ncolors; i ++, ptr ++) {
	// Get the color's character
	lineptr = *ptr;
	ch      = *lineptr++;

        if (chars_per_color > 1) ch = (ch << 8) | *lineptr++;

	// Get the color value...
	if ((lineptr = strstr(lineptr, "c ")) == NULL) {
	  // No color; make this black...
	  colors[ch] = FL_BLACK;
	} else if (lineptr[2] == '#') {
	  // Read the RGB triplet...
	  lineptr += 3;
	  for (j = 0; j < 12; j ++)
            if (!isxdigit(lineptr[j]))
	      break;

	  switch (j) {
            case 0 :
		bg = ch;
	    default :
		red = green = blue = 0;
		break;

            case 3 :
		val[0] = lineptr[0];
		val[1] = '\0';
		red = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[1];
		val[1] = '\0';
		green = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[2];
		val[1] = '\0';
		blue = 255 * strtol(val, NULL, 16) / 15;
		break;

            case 6 :
            case 9 :
            case 12 :
		j /= 3;

		val[0] = lineptr[0];
		val[1] = lineptr[1];
		val[2] = '\0';
		red = strtol(val, NULL, 16);

		val[0] = lineptr[j + 0];
		val[1] = lineptr[j + 1];
		val[2] = '\0';
		green = strtol(val, NULL, 16);

		val[0] = lineptr[2 * j + 0];
		val[1] = lineptr[2 * j + 1];
		val[2] = '\0';
		blue = strtol(val, NULL, 16);
		break;
	  }

	  colors[ch] = fl_rgb_color((uchar)red, (uchar)green, (uchar)blue);
	} else {
	  // Read a color name...
	  if (strncasecmp(lineptr + 2, "white", 5) == 0) colors[ch] = FL_WHITE;
	  else if (strncasecmp(lineptr + 2, "black", 5) == 0) colors[ch] = FL_BLACK;
	  else if (strncasecmp(lineptr + 2, "none", 4) == 0) {
            colors[ch] = FL_BLACK;
	    bg = ch;
	  } else colors[ch] = FL_GRAY;
	}
      }
    }

    // Read the image data...
    for (y = 0; y < img->h(); y ++, ptr ++) {
      lineptr = *ptr;
      startx  = 0;
      ch      = bg;

      for (x = 0; x < img->w(); x ++) {
	newch = *lineptr++;

        if (chars_per_color > 1) newch = (newch << 8) | *lineptr++;

	if (newch != ch) {
	  if (ch != bg) {
            add_color(colors[ch]);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
          }

	  ch     = newch;
	  startx = x;
	}
      }

      if (ch != bg) {
	add_color(colors[ch]);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }

    // Free the colormap...
    delete[] colors;
  }

  img->release();

#ifdef DEBUG
{
  int i;
  printf("Icon File \"%s\":\n", ifile);
  for (i = 0; i < num_data_; i ++)
  {
    printf("    %d,\n", data_[i]);
  }
}
#endif // DEBUG

  return 0;
}